

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O2

void __thiscall
compiler::CompilerAstWalker::onEnterLiteralExpressionAstNode
          (CompilerAstWalker *this,LiteralExpressionAstNode *node)

{
  pointer pcVar1;
  element_type *__str;
  bool bVar2;
  char *pcVar3;
  longlong t;
  size_t sVar4;
  long lVar5;
  double t_00;
  ByteCodeInstruction BStack_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  
  __str = (node->token).super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  switch(__str->tokenType) {
  case BooleanLiteral:
    bVar2 = std::operator==(&__str->value,"true");
    if (bVar2) {
      BStack_80 = LoadBooleanTrueConstant;
    }
    else {
      bVar2 = std::operator==(&((node->token).super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->value,"false");
      if (!bVar2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_58,
                   "Encountered unknown boolean literal value in AstCompiler.cpp onEnterLiteralExpressionAstNode"
                   ,(allocator<char> *)(str.field_2._M_local_buf + 0xf));
        Error::assertWithPanic(false,(string *)local_58);
        goto LAB_0011be16;
      }
      BStack_80 = LoadBooleanFalseConstant;
    }
    break;
  case UndefinedLiteral:
    BStack_80 = LoadUndefinedConstant;
    break;
  default:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_58,
               "Encountered unknown literal type in AstCompiler.cpp onEnterLiteralExpressionAstNode"
               ,(allocator<char> *)(str.field_2._M_local_buf + 0xf));
    Error::assertWithPanic(false,(string *)local_58);
    goto LAB_0011be16;
  case StringLiteral:
    std::__cxx11::string::substr((ulong)local_58,(ulong)__str);
    for (lVar5 = 1; pcVar1 = (pointer)(lVar5 - 1), pcVar1 < str._M_dataplus._M_p; lVar5 = lVar5 + 1)
    {
      pcVar3 = (char *)std::__cxx11::string::at((ulong)local_58);
      if (((*pcVar3 == '\\') && (pcVar1 < str._M_dataplus._M_p + -1)) &&
         (pcVar3 = (char *)std::__cxx11::string::at((ulong)local_58), *pcVar3 == 'n')) {
        std::__cxx11::string::replace((ulong)local_58,(ulong)pcVar1,(char *)0x2);
        std::__cxx11::string::_M_assign((string *)local_58);
      }
    }
    std::__cxx11::string::string((string *)&local_78,(string *)local_58);
    sVar4 = indexOfConstant<std::__cxx11::string>
                      (this,&local_78,&this->stringConstants,&this->stringConstantsLookup);
    std::__cxx11::string::~string((string *)&local_78);
    emit(this,LoadStringConstant,sVar4);
LAB_0011be16:
    std::__cxx11::string::~string((string *)local_58);
    return;
  case IntegerLiteral:
    t = std::__cxx11::stoll(&__str->value,(size_t *)0x0,10);
    sVar4 = indexOfConstant<long>(this,t,&this->intConstants,&this->intConstantsLookup);
    BStack_80 = LoadIntegerConstant;
    goto LAB_0011bd7d;
  case FloatLiteral:
    t_00 = std::__cxx11::stod(&__str->value,(size_t *)0x0);
    sVar4 = indexOfConstant<double>(this,t_00,&this->floatConstants,&this->floatConstantsLookup);
    BStack_80 = LoadFloatConstant;
LAB_0011bd7d:
    emit(this,BStack_80,sVar4);
    return;
  }
  emit(this,BStack_80);
  return;
}

Assistant:

void onEnterLiteralExpressionAstNode(LiteralExpressionAstNode* node) noexcept override {
    switch (node->token->tokenType) {
      case TokenType::BooleanLiteral: {
        if (node->token->value == "true") {
          this->emit(bytecode::ByteCodeInstruction::LoadBooleanTrueConstant);
        } else if (node->token->value == "false") {
          this->emit(bytecode::ByteCodeInstruction::LoadBooleanFalseConstant);
        } else {
          Error::assertWithPanic(false, "Encountered unknown boolean literal value in AstCompiler.cpp onEnterLiteralExpressionAstNode");
        }
        return;
      }
      case TokenType::FloatLiteral: {
        double val = std::stod(node->token->value);
        std::size_t index = this->indexOfConstant(val, this->floatConstants, this->floatConstantsLookup);
        this->emit(bytecode::ByteCodeInstruction::LoadFloatConstant, index);
        return;
      }
      case TokenType::IntegerLiteral: {
        std::int64_t val = std::stoll(node->token->value);
        std::size_t index = this->indexOfConstant(val, this->intConstants, this->intConstantsLookup);
        this->emit(bytecode::ByteCodeInstruction::LoadIntegerConstant, index);
        return;
      }
      case TokenType::UndefinedLiteral: {
        this->emit(bytecode::ByteCodeInstruction::LoadUndefinedConstant);
        return;
      }
      case TokenType::StringLiteral: {
        auto str = node->token->value.substr(1, node->token->value.length() - 2);
        for (std::size_t i = 0; i < str.length(); i++) {
          if (str.at(i) == '\\' && i < str.length() - 1 && str.at(i + 1) == 'n') {
            str = str.replace(i, 2, "\n");
          }
        }
        std::size_t index = this->indexOfConstant(str, this->stringConstants, this->stringConstantsLookup);
        this->emit(bytecode::ByteCodeInstruction::LoadStringConstant, index);
        return;
      }
      default: {
        Error::assertWithPanic(false, "Encountered unknown literal type in AstCompiler.cpp onEnterLiteralExpressionAstNode");
        return;
      }
    }
  }